

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElKernelHDiv3D.cpp
# Opt level: O2

void __thiscall
TPZCompElKernelHDiv3D<pzshape::TPZShapePrism>::ComputeShape
          (TPZCompElKernelHDiv3D<pzshape::TPZShapePrism> *this,TPZVec<double> *qsi,
          TPZMaterialData *data)

{
  bool bVar1;
  uint uVar2;
  long *plVar3;
  ulong uVar4;
  ulong uVar5;
  TPZShapeData *shapedata;
  double local_158;
  TPZFMatrix<double> curlHCurl;
  TPZFMatrix<double> phiHCurl;
  
  bVar1 = data->fNeedsSol;
  data->fNeedsSol = true;
  uVar2 = (**(code **)(*(long *)&(this->super_TPZCompElHCurl<pzshape::TPZShapePrism>).
                                 super_TPZIntelGen<pzshape::TPZShapePrism>.
                                 super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                 super_TPZCompEl + 600))();
  curlHCurl.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)0x0;
  TPZFMatrix<double>::TPZFMatrix(&phiHCurl,3,(long)(int)uVar2,(double *)&curlHCurl);
  local_158 = 0.0;
  TPZFMatrix<double>::TPZFMatrix(&curlHCurl,3,(long)(int)uVar2,&local_158);
  TPZShapeHCurlNoGrads<pzshape::TPZShapePrism>::Shape
            (qsi,&data->super_TPZShapeData,&phiHCurl,&curlHCurl);
  TPZCompElHCurl<pzshape::TPZShapePrism>::TransformCurl<3>
            (&curlHCurl,data->detjac,&(data->jacobian).super_TPZFMatrix<double>,
             &(data->curlphi).super_TPZFMatrix<double>);
  data->fNeedsSol = bVar1;
  if (uVar2 != (uint)(data->curlphi).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                     super_TPZBaseMatrix.fCol) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/TPZCompElKernelHDiv3D.cpp"
               ,0x86);
  }
  TPZFMatrix<double>::operator=
            (&(data->fDeformedDirections).super_TPZFMatrix<double>,
             &(data->curlphi).super_TPZFMatrix<double>);
  TPZFMatrix<double>::operator=(&(data->phi).super_TPZFMatrix<double>,1.0);
  TPZFMatrix<double>::operator=(&(data->dphix).super_TPZFMatrix<double>,1.0);
  uVar4 = 0;
  uVar5 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar5 = uVar4;
  }
  plVar3 = &((data->fVecShapeIndex).super_TPZVec<std::pair<int,_long>_>.fStore)->second;
  for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    ((pair<int,_long> *)(plVar3 + -1))->first = (int)uVar4;
    *plVar3 = uVar4;
    plVar3 = plVar3 + 2;
  }
  TPZFMatrix<double>::~TPZFMatrix(&curlHCurl);
  TPZFMatrix<double>::~TPZFMatrix(&phiHCurl);
  return;
}

Assistant:

void TPZCompElKernelHDiv3D<TSHAPE>::ComputeShape(TPZVec<REAL> &qsi, TPZMaterialData &data){
                                                
    bool needsol = data.fNeedsSol;
    data.fNeedsSol = true;

    auto nshape = this->NShapeF();
    TPZFMatrix<REAL> phiHCurl(3,nshape,0.);
    TPZFMatrix<REAL> curlHCurl(3,nshape,0.);

    TPZShapeHCurlNoGrads<TSHAPE>::Shape(qsi,data,phiHCurl,curlHCurl);
    TPZCompElHCurl<TSHAPE>::TransformCurl(curlHCurl, data.detjac, data.jacobian, data.curlphi);    
    
    data.fNeedsSol = needsol;
    if (TSHAPE::Dimension == 3){        
        TPZShapeData &shapedata = data;
        int size = data.curlphi.Cols();
        if (size != nshape) DebugStop();
        int ncorner = TSHAPE::NCornerNodes;
        data.fDeformedDirections = data.curlphi;
        data.phi = 1.;
        data.dphix = 1.;
        
    } else if (TSHAPE::Dimension == 2) {
        if (data.phi.Rows()>1){
            for (int i = 0; i < data.phi.Rows(); i++){
                data.phi(i,0) = data.curlphi(0,i);
            }
        }
    } else {
        DebugStop();
    }

    for (int j = 0; j < nshape; j++){
        data.fVecShapeIndex[j].first = j;
        data.fVecShapeIndex[j].second = j;
    }

}